

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QPrinterInfo>::relocate
          (QArrayDataPointer<QPrinterInfo> *this,qsizetype offset,QPrinterInfo **data)

{
  bool bVar1;
  QPrinterInfo *in_RDX;
  long in_RSI;
  QArrayDataPointer<QPrinterInfo> *in_RDI;
  QPrinterInfo **unaff_retaddr;
  QPrinterInfo *res;
  QPrinterInfo *n;
  QArrayDataPointer<QPrinterInfo> *c;
  
  n = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QPrinterInfo,long_long>(in_RDX,(longlong)n,(QPrinterInfo *)in_RDI)
  ;
  if ((in_RDX != (QPrinterInfo *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<QPrinterInfo>,QPrinterInfo_const*>
                        (unaff_retaddr,c), bVar1)) {
    (in_RDX->d_ptr).d =
         (QPrinterInfoPrivate *)(&(((in_RDX->d_ptr).d)->m_printDevice).d.value + in_RSI);
  }
  in_RDI->ptr = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }